

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

bool crnlib::command_line_params::split_params(char *p,dynamic_string_array *params)

{
  char cVar1;
  long in_RDI;
  char c;
  dynamic_string str;
  uint ofs;
  bool within_quote;
  bool within_param;
  undefined7 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffaf;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  dynamic_string local_30;
  uint local_20;
  byte local_1a;
  byte local_19;
  long local_10;
  byte local_1;
  
  local_19 = 0;
  local_1a = 0;
  local_20 = 0;
  local_10 = in_RDI;
  dynamic_string::dynamic_string(&local_30);
  for (; *(char *)(local_10 + (ulong)local_20) != '\0'; local_20 = local_20 + 1) {
    cVar1 = *(char *)(local_10 + (ulong)local_20);
    if ((local_19 & 1) == 0) {
      if ((cVar1 != ' ') && (cVar1 != '\t')) {
        local_19 = 1;
        if (cVar1 == '\"') {
          local_1a = 1;
        }
        dynamic_string::append_char
                  ((dynamic_string *)
                   CONCAT17(in_stack_ffffffffffffffb7,
                            CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                   in_stack_ffffffffffffffaf);
      }
    }
    else if ((local_1a & 1) == 0) {
      if ((cVar1 == ' ') || (cVar1 == '\t')) {
        in_stack_ffffffffffffffb7 = dynamic_string::is_empty(&local_30);
        if (!(bool)in_stack_ffffffffffffffb7) {
          vector<crnlib::dynamic_string>::push_back
                    ((vector<crnlib::dynamic_string> *)
                     CONCAT17(in_stack_ffffffffffffffb7,
                              CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                     (dynamic_string *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8)
                    );
          dynamic_string::clear
                    ((dynamic_string *)
                     CONCAT17(in_stack_ffffffffffffffb7,
                              CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)));
        }
        local_19 = 0;
      }
      else {
        if (cVar1 == '\"') {
          local_1a = 1;
        }
        dynamic_string::append_char
                  ((dynamic_string *)
                   CONCAT17(in_stack_ffffffffffffffb7,
                            CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                   in_stack_ffffffffffffffaf);
      }
    }
    else {
      if (cVar1 == '\"') {
        local_1a = 0;
      }
      dynamic_string::append_char
                ((dynamic_string *)
                 CONCAT17(in_stack_ffffffffffffffb7,
                          CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                 in_stack_ffffffffffffffaf);
    }
  }
  if ((local_1a & 1) == 0) {
    in_stack_ffffffffffffffb6 = dynamic_string::is_empty(&local_30);
    if (!(bool)in_stack_ffffffffffffffb6) {
      vector<crnlib::dynamic_string>::push_back
                ((vector<crnlib::dynamic_string> *)
                 CONCAT17(in_stack_ffffffffffffffb7,
                          CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                 (dynamic_string *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    }
    local_1 = 1;
  }
  else {
    console::error("Unmatched quote in command line \"%s\"",local_10);
    local_1 = 0;
  }
  dynamic_string::~dynamic_string
            ((dynamic_string *)
             CONCAT17(in_stack_ffffffffffffffb7,
                      CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)));
  return (bool)(local_1 & 1);
}

Assistant:

bool command_line_params::split_params(const char* p, dynamic_string_array& params) {
  bool within_param = false;
  bool within_quote = false;

  uint ofs = 0;
  dynamic_string str;

  while (p[ofs]) {
    const char c = p[ofs];

    if (within_param) {
      if (within_quote) {
        if (c == '"')
          within_quote = false;

        str.append_char(c);
      } else if ((c == ' ') || (c == '\t')) {
        if (!str.is_empty()) {
          params.push_back(str);
          str.clear();
        }
        within_param = false;
      } else {
        if (c == '"')
          within_quote = true;

        str.append_char(c);
      }
    } else if ((c != ' ') && (c != '\t')) {
      within_param = true;

      if (c == '"')
        within_quote = true;

      str.append_char(c);
    }

    ofs++;
  }

  if (within_quote) {
    console::error("Unmatched quote in command line \"%s\"", p);
    return false;
  }

  if (!str.is_empty())
    params.push_back(str);

  return true;
}